

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

DynamicEntryList * __thiscall
cmELFInternalImpl<cmELFTypes32>::GetDynamicEntries
          (DynamicEntryList *__return_storage_ptr__,cmELFInternalImpl<cmELFTypes32> *this)

{
  bool bVar1;
  ELF_Dyn *dyn;
  pointer paVar2;
  pair<long,_unsigned_long> local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = LoadDynamicSection(this);
  if (bVar1) {
    std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
    reserve(__return_storage_ptr__,
            (long)(this->DynamicSectionEntries).
                  super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->DynamicSectionEntries).
                  super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3);
    for (paVar2 = (this->DynamicSectionEntries).
                  super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>._M_impl.
                  super__Vector_impl_data._M_start;
        paVar2 != (this->DynamicSectionEntries).
                  super__Vector_base<Elf32_Dyn,_std::allocator<Elf32_Dyn>_>._M_impl.
                  super__Vector_impl_data._M_finish; paVar2 = paVar2 + 1) {
      local_30.first = (long)paVar2->d_tag;
      local_30.second = (unsigned_long)(paVar2->d_un).d_val;
      std::vector<std::pair<long,unsigned_long>,std::allocator<std::pair<long,unsigned_long>>>::
      emplace_back<std::pair<long,unsigned_long>>
                ((vector<std::pair<long,unsigned_long>,std::allocator<std::pair<long,unsigned_long>>>
                  *)__return_storage_ptr__,&local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmELF::DynamicEntryList cmELFInternalImpl<Types>::GetDynamicEntries()
{
  cmELF::DynamicEntryList result;

  // Ensure entries have been read from file
  if (!this->LoadDynamicSection()) {
    return result;
  }

  // Copy into public array
  result.reserve(this->DynamicSectionEntries.size());
  for (typename std::vector<ELF_Dyn>::iterator di =
         this->DynamicSectionEntries.begin();
       di != this->DynamicSectionEntries.end(); ++di) {
    ELF_Dyn& dyn = *di;
    result.push_back(
      std::pair<unsigned long, unsigned long>(dyn.d_tag, dyn.d_un.d_val));
  }

  return result;
}